

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall google::protobuf::FieldDescriptor::is_packed(FieldDescriptor *this)

{
  byte bVar1;
  Nonnull<const_char_*> pcVar2;
  bool bVar3;
  
  bVar1 = this->field_0x1;
  bVar3 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar3) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar3,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    bVar3 = false;
    if (((this->field_0x1 & 0x20) != 0) && (bVar3 = false, this->type_ - 0xd < 0xfffffffc)) {
      bVar3 = (this->merged_features_->field_0)._impl_.repeated_field_encoding_ == 1;
    }
    return bVar3;
  }
  is_packed();
}

Assistant:

bool FieldDescriptor::is_packed() const {
  if (!is_packable()) return false;
  return features().repeated_field_encoding() == FeatureSet::PACKED;
}